

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void ptls_aead__build_iv(ptls_aead_context_t *ctx,uint8_t *iv,uint64_t seq)

{
  uint8_t uVar1;
  long lVar2;
  long lVar3;
  uint8_t *puVar4;
  bool bVar5;
  
  puVar4 = ctx->static_iv;
  lVar2 = ctx->algo->iv_size - 8;
  while (bVar5 = lVar2 != 0, lVar2 = lVar2 + -1, bVar5) {
    uVar1 = *puVar4;
    puVar4 = puVar4 + 1;
    *iv = uVar1;
    iv = iv + 1;
  }
  lVar2 = 0x38;
  lVar3 = 0;
  do {
    iv[lVar3] = (byte)(seq >> ((byte)lVar2 & 0x3f)) ^ puVar4[lVar3];
    lVar2 = lVar2 + -8;
    lVar3 = lVar3 + 1;
  } while (lVar2 != -8);
  return;
}

Assistant:

void ptls_aead__build_iv(ptls_aead_context_t *ctx, uint8_t *iv, uint64_t seq)
{
    size_t iv_size = ctx->algo->iv_size, i;
    const uint8_t *s = ctx->static_iv;
    uint8_t *d = iv;

    /* build iv */
    for (i = iv_size - 8; i != 0; --i)
        *d++ = *s++;
    i = 64;
    do {
        i -= 8;
        *d++ = *s++ ^ (uint8_t)(seq >> i);
    } while (i != 0);
}